

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::Application(Application *this,AppConfig config)

{
  _Rb_tree_header *p_Var1;
  PathTracer *this_00;
  
  (this->super_Renderer)._vptr_Renderer = (_func_int **)&PTR__Application_00275260;
  p_Var1 = &(this->ikTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->ikTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ikTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ikTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ikTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ikTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->camera).c2w.entries[0].x = 0.0;
  (this->camera).c2w.entries[0].y = 0.0;
  (this->camera).c2w.entries[0].z = 0.0;
  (this->camera).c2w.entries[1].x = 0.0;
  (this->camera).c2w.entries[2].z = 0.0;
  (this->camera).c2w.entries[1].y = 0.0;
  (this->camera).c2w.entries[1].z = 0.0;
  (this->camera).c2w.entries[2].x = 0.0;
  (this->camera).c2w.entries[2].y = 0.0;
  (this->camera).pos.x = 0.0;
  (this->camera).pos.y = 0.0;
  (this->camera).pos.z = 0.0;
  (this->camera).targetPos.x = 0.0;
  (this->camera).targetPos.y = 0.0;
  (this->camera).targetPos.z = 0.0;
  (this->canonicalCamera).c2w.entries[0].x = 0.0;
  (this->canonicalCamera).c2w.entries[0].y = 0.0;
  (this->canonicalCamera).c2w.entries[0].z = 0.0;
  (this->canonicalCamera).c2w.entries[1].x = 0.0;
  (this->canonicalCamera).c2w.entries[1].y = 0.0;
  (this->canonicalCamera).c2w.entries[1].z = 0.0;
  (this->canonicalCamera).c2w.entries[2].x = 0.0;
  (this->canonicalCamera).c2w.entries[2].y = 0.0;
  (this->canonicalCamera).c2w.entries[2].z = 0.0;
  (this->canonicalCamera).targetPos.y = 0.0;
  (this->canonicalCamera).targetPos.z = 0.0;
  (this->canonicalCamera).pos.z = 0.0;
  (this->canonicalCamera).targetPos.x = 0.0;
  (this->canonicalCamera).pos.x = 0.0;
  (this->canonicalCamera).pos.y = 0.0;
  DynamicScene::DrawStyle::DrawStyle(&this->defaultStyle);
  DynamicScene::DrawStyle::DrawStyle(&this->hoverStyle);
  DynamicScene::DrawStyle::DrawStyle(&this->selectStyle);
  OSDText::OSDText(&this->textManager);
  (this->text_color).r = 0.0;
  (this->text_color).g = 0.0;
  (this->text_color).b = 0.0;
  (this->text_color).a = 1.0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Timeline::Timeline(&this->timeline);
  this->scene = (Scene *)0x0;
  this_00 = (PathTracer *)operator_new(0x1e8);
  PathTracer::PathTracer
            (this_00,config.pathtracer_ns_aa,config.pathtracer_max_ray_depth,
             config.pathtracer_ns_area_light,config.pathtracer_ns_diff,config.pathtracer_ns_glsy,
             config.pathtracer_ns_refr,config.pathtracer_num_threads,config.pathtracer_envmap);
  this->pathtracer = this_00;
  this->timestep = 0.1;
  this->damping_factor = 0.0;
  this->readyWrite = false;
  this->readyLoad = false;
  this->useCapsuleRadius = true;
  return;
}

Assistant:

Application::Application(AppConfig config)
{
   scene = nullptr;

   pathtracer = new PathTracer (
         config.pathtracer_ns_aa,
         config.pathtracer_max_ray_depth,
         config.pathtracer_ns_area_light,
         config.pathtracer_ns_diff,
         config.pathtracer_ns_glsy,
         config.pathtracer_ns_refr,
         config.pathtracer_num_threads,
         config.pathtracer_envmap
         );

   timestep = 0.1;
   damping_factor = 0.0;

   readyWrite = false;
   readyLoad = false;
   useCapsuleRadius = true;
}